

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsmp.cc
# Opt level: O0

void __thiscall bsplib::Bsmp::sync(Bsmp *this)

{
  size_t __dest;
  int iVar1;
  int iVar2;
  void *__src;
  void *pvVar3;
  exception *peVar4;
  exception *peVar5;
  byte in_SIL;
  char local_3be [2];
  int local_3bc;
  exception local_3b8;
  unsigned_long local_218;
  size_t tag_size;
  exception local_200;
  unsigned_long local_60;
  size_t counter;
  void *payload;
  pair<unsigned_long,_unsigned_long> local_48;
  void *local_38;
  void *tag;
  size_t payload_size;
  size_t size;
  int p_1;
  int p;
  uint marker;
  bool dummy_local;
  Bsmp *this_local;
  
  p._3_1_ = in_SIL & 1;
  _marker = this;
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::clear(&this->m_payloads);
  AlignedBuf::clear(&this->m_tag_buffer);
  AlignedBuf::clear(&this->m_payload_buffer);
  if ((p._3_1_ & 1) == 0) {
    p_1 = 0;
    for (size._4_4_ = 0; iVar1 = size._4_4_, iVar2 = A2A::nprocs(&this->m_a2a), iVar1 < iVar2;
        size._4_4_ = size._4_4_ + 1) {
      serial<unsigned_int>(&this->m_a2a,size._4_4_,0);
      serial<unsigned_long>(&this->m_a2a,size._4_4_,this->m_set_tag_size_counter);
      serial<unsigned_long>(&this->m_a2a,size._4_4_,this->m_next_tag_size);
    }
    A2A::exchange(&this->m_a2a);
    this->m_total_n_messages = 0;
    this->m_total_payload = 0;
    for (size._0_4_ = 0; iVar1 = (int)size, iVar2 = A2A::nprocs(&this->m_a2a), iVar1 < iVar2;
        size._0_4_ = (int)size + 1) {
      while (deserial<unsigned_long>(&this->m_a2a,(int)size,&payload_size), payload_size != 0) {
        tag = (void *)(payload_size - 1);
        local_38 = AlignedBuf::append(&this->m_tag_buffer,this->m_send_tag_size);
        payload = (void *)AlignedBuf::size(&this->m_payload_buffer);
        local_48 = std::make_pair<unsigned_long,unsigned_long&>
                             ((unsigned_long *)&payload,(unsigned_long *)&tag);
        std::
        vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ::push_back(&this->m_payloads,&local_48);
        counter = (size_t)AlignedBuf::append(&this->m_payload_buffer,(size_t)tag);
        pvVar3 = local_38;
        __src = A2A::recv_top(&this->m_a2a,(int)size);
        memcpy(pvVar3,__src,this->m_send_tag_size);
        A2A::recv_pop(&this->m_a2a,(int)size,this->m_send_tag_size);
        __dest = counter;
        pvVar3 = A2A::recv_top(&this->m_a2a,(int)size);
        memcpy((void *)__dest,pvVar3,(size_t)tag);
        A2A::recv_pop(&this->m_a2a,(int)size,(size_t)tag);
        this->m_total_n_messages = this->m_total_n_messages + 1;
        this->m_total_payload = (long)tag + this->m_total_payload;
      }
      local_60 = 0xffffffffffffffff;
      deserial<unsigned_long>(&this->m_a2a,(int)size,&local_60);
      if (local_60 != this->m_set_tag_size_counter) {
        tag_size._3_1_ = 1;
        peVar4 = (exception *)__cxa_allocate_exception(0x1a0);
        exception::exception(&local_200,"bsp_set_tagsize");
        peVar5 = exception::operator<<
                           (&local_200,
                            (char (*) [57])
                            "Not all processes set the tag size same number of times\n");
        exception::exception(peVar4,peVar5);
        tag_size._3_1_ = 0;
        __cxa_throw(peVar4,&exception::typeinfo,exception::~exception);
      }
      local_218 = 0xffffffffffffffff;
      deserial<unsigned_long>(&this->m_a2a,(int)size,&local_218);
      if (local_218 != this->m_next_tag_size) {
        peVar4 = (exception *)__cxa_allocate_exception(0x1a0);
        exception::exception(&local_3b8,"bsp_set_tagsize");
        peVar5 = exception::operator<<
                           (&local_3b8,
                            (char (*) [47])"Not all processes announced the same tag size\n");
        peVar5 = exception::operator<<(peVar5,(char (*) [14])"  -> process ");
        local_3bc = A2A::pid(&this->m_a2a);
        peVar5 = exception::operator<<(peVar5,&local_3bc);
        peVar5 = exception::operator<<(peVar5,(char (*) [6])" got ");
        peVar5 = exception::operator<<(peVar5,&this->m_next_tag_size);
        local_3be[1] = 10;
        peVar5 = exception::operator<<(peVar5,local_3be + 1);
        peVar5 = exception::operator<<(peVar5,(char (*) [14])"  -> process ");
        peVar5 = exception::operator<<(peVar5,(int *)&size);
        peVar5 = exception::operator<<(peVar5,(char (*) [6])" got ");
        peVar5 = exception::operator<<(peVar5,&local_218);
        local_3be[0] = '\n';
        peVar5 = exception::operator<<(peVar5,local_3be);
        exception::exception(peVar4,peVar5);
        __cxa_throw(peVar4,&exception::typeinfo,exception::~exception);
      }
    }
  }
  this->m_send_empty = true;
  this->m_recv_tag_size = this->m_send_tag_size;
  this->m_send_tag_size = this->m_next_tag_size;
  this->m_set_tag_size_counter = 0;
  return;
}

Assistant:

void Bsmp::sync( bool dummy ) 
{
    m_payloads.clear();
    m_tag_buffer.clear();
    m_payload_buffer.clear();

    if (!dummy) {
#ifdef PROFILE
    TicToc t( TicToc::BSMP);
#endif

    const unsigned marker = 0;
    for (int p = 0; p < m_a2a.nprocs(); ++p ) {
        serial( m_a2a, p, marker );
        serial( m_a2a, p, m_set_tag_size_counter );
        serial( m_a2a, p, m_next_tag_size );
    
#ifdef PROFILE
        t.add_bytes( m_a2a.send_size(p) );
#endif
    }

    m_a2a.exchange( );

    m_total_n_messages = 0; 
    m_total_payload = 0;
    for (int p = 0 ; p < m_a2a.nprocs(); ++p )
    {
        size_t size;
        while ( deserial( m_a2a, p, size ), size != marker ) {
            size_t payload_size = size - 1;

            void * tag = m_tag_buffer.append( m_send_tag_size );
            m_payloads.push_back(
                    std::make_pair( m_payload_buffer.size(), payload_size ) 
                    );
            void * payload = m_payload_buffer.append( payload_size );
          
            std::memcpy( tag, m_a2a.recv_top(p), m_send_tag_size );
            m_a2a.recv_pop(p, m_send_tag_size );
            std::memcpy( payload, m_a2a.recv_top(p), payload_size );
            m_a2a.recv_pop(p, payload_size );

            m_total_n_messages += 1;
            m_total_payload += payload_size;
        }

        size_t counter = size_t(-1);
        deserial( m_a2a, p, counter );
        if (counter != m_set_tag_size_counter )
            throw exception("bsp_set_tagsize") 
                << "Not all processes set the tag size same number of times\n";

        size_t tag_size = size_t(-1);
        deserial( m_a2a, p, tag_size );
        if (tag_size != m_next_tag_size)
            throw exception("bsp_set_tagsize") 
                << "Not all processes announced the same tag size\n"
                << "  -> process " << m_a2a.pid() 
                                   << " got " << m_next_tag_size << '\n'
                << "  -> process " << p << " got " << tag_size << '\n';
    } 
    } // if (!dummy)
    
    m_send_empty = true;

    // update tag size
    m_recv_tag_size = m_send_tag_size;
    m_send_tag_size = m_next_tag_size;
    m_set_tag_size_counter = 0;
}